

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PolyKernel::SerializeWithCachedSizes
          (PolyKernel *this,CodedOutputStream *output)

{
  int32 iVar1;
  uint value;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  void *extraout_RDX_01;
  CodedOutputStream *pCVar3;
  double extraout_XMM0_Qa;
  double value_00;
  double extraout_XMM0_Qa_00;
  double dVar4;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  PolyKernel *this_local;
  
  pCVar3 = output;
  iVar1 = degree(this);
  pvVar2 = extraout_RDX;
  if (iVar1 != 0) {
    value = degree(this);
    pCVar3 = (CodedOutputStream *)(ulong)value;
    google::protobuf::internal::WireFormatLite::WriteInt32(1,value,output);
    pvVar2 = extraout_RDX_00;
  }
  c(this,pCVar3,pvVar2);
  if ((extraout_XMM0_Qa != 0.0) || (dVar4 = extraout_XMM0_Qa, NAN(extraout_XMM0_Qa))) {
    c(this,pCVar3,extraout_RDX_01);
    google::protobuf::internal::WireFormatLite::WriteDouble(2,value_00,output);
    dVar4 = extraout_XMM0_Qa_00;
  }
  dVar4 = gamma(this,dVar4);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar4 = gamma(this,dVar4);
    google::protobuf::internal::WireFormatLite::WriteDouble(3,dVar4,output);
  }
  return;
}

Assistant:

void PolyKernel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PolyKernel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 degree = 1;
  if (this->degree() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->degree(), output);
  }

  // double c = 2;
  if (this->c() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->c(), output);
  }

  // double gamma = 3;
  if (this->gamma() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(3, this->gamma(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PolyKernel)
}